

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O1

void duckdb::ConcatFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long *plVar1;
  ulong *puVar2;
  char cVar3;
  VectorType VVar4;
  VectorType VVar5;
  uint uVar6;
  uint uVar7;
  pointer pVVar8;
  sel_t *psVar9;
  unsigned_long *puVar10;
  list_entry_t *plVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  SelectionVector *pSVar13;
  void *pvVar14;
  SelectionVector *pSVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  bool bVar20;
  BoundFunctionExpression *pBVar21;
  pointer pFVar22;
  Vector *child_vec;
  idx_t iVar23;
  long lVar24;
  TemplatedValidityData<unsigned_long> *pTVar25;
  reference pvVar26;
  reference vector;
  size_type sVar27;
  ulong uVar28;
  ulong uVar29;
  reference pvVar30;
  uint *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  buffer_ptr<ValidityBuffer> *pbVar34;
  buffer_ptr<ValidityBuffer> *pbVar35;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t iVar36;
  idx_t len;
  idx_t extraout_RDX_02;
  pointer extraout_RDX_03;
  pointer extraout_RDX_04;
  pointer pLVar37;
  idx_t extraout_RDX_05;
  idx_t extraout_RDX_06;
  idx_t extraout_RDX_07;
  idx_t extraout_RDX_08;
  undefined1 auVar38 [8];
  ulong uVar39;
  data_ptr_t pdVar40;
  data_ptr_t pdVar41;
  data_ptr_t pdVar42;
  ulong uVar43;
  undefined1 *puVar44;
  char *pcVar45;
  pointer pLVar46;
  undefined1 (*pauVar47) [16];
  void *pvVar48;
  buffer_ptr<ValidityBuffer> *pbVar49;
  idx_t idx_in_entry;
  pointer vector_00;
  size_type sVar50;
  data_ptr_t pdVar51;
  pointer pLVar52;
  idx_t a_length;
  size_type sVar53;
  string_t sVar54;
  string_t target_7;
  vector<duckdb::ListConcatInputData,_true> input_data;
  string_t target;
  long local_1a0;
  undefined1 local_198 [16];
  pointer local_188;
  buffer_ptr<ValidityBuffer> *local_180;
  pointer local_178;
  undefined1 (*local_170) [16];
  ValidityMask *local_168;
  ulong local_160;
  undefined1 local_158 [8];
  pointer pLStack_150;
  pointer local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  undefined1 local_108 [16];
  unsigned_long *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  UnifiedVectorFormat local_b0;
  list_entry_t *local_68;
  undefined8 local_58;
  void *local_50;
  ulong local_48;
  undefined8 local_40;
  data_ptr_t local_38;
  
  pBVar21 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar22 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar21->bind_info);
  cVar3 = *(char *)&pFVar22[4]._vptr_FunctionData;
  if (*(char *)&pFVar22[1]._vptr_FunctionData == 'e') {
    iVar36 = args->count;
    local_178 = (pointer)result->data;
    local_158 = (undefined1  [8])0x0;
    pLStack_150 = (pointer)0x0;
    local_148 = (pointer)0x0;
    vector_00 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
    pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (vector_00 != pVVar8) {
      do {
        if ((cVar3 != '\0') || ((vector_00->type).id_ != SQLNULL)) {
          child_vec = ListVector::GetEntry(vector_00);
          ListConcatInputData::ListConcatInputData
                    ((ListConcatInputData *)local_108,vector_00,child_vec);
          Vector::ToUnifiedFormat(vector_00,iVar36,(UnifiedVectorFormat *)local_108);
          local_68 = (list_entry_t *)local_108._8_8_;
          iVar23 = ListVector::GetListSize(vector_00);
          Vector::ToUnifiedFormat(child_vec,iVar23,&local_b0);
          ::std::vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>::
          emplace_back<duckdb::ListConcatInputData>
                    ((vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>
                      *)local_158,(ListConcatInputData *)local_108);
          if (local_b0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
          }
          if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
          }
        }
        vector_00 = vector_00 + 1;
      } while (vector_00 != pVVar8);
    }
    FlatVector::VerifyFlatVector(result);
    if (iVar36 == 0) {
      iVar23 = 0;
    }
    else {
      local_180 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      iVar23 = 0;
      uVar43 = 0;
      do {
        pLVar37 = pLStack_150;
        pLVar46 = local_178;
        lVar24 = uVar43 * 0x10;
        *(idx_t *)((long)local_178 + lVar24) = iVar23;
        pdVar51 = (data_ptr_t)((long)local_178 + lVar24 + 8);
        pdVar51[0] = '\0';
        pdVar51[1] = '\0';
        pdVar51[2] = '\0';
        pdVar51[3] = '\0';
        pdVar51[4] = '\0';
        pdVar51[5] = '\0';
        pdVar51[6] = '\0';
        pdVar51[7] = '\0';
        if (local_158 != (undefined1  [8])pLStack_150) {
          local_188 = (pointer)(uVar43 >> 6);
          bVar16 = (byte)uVar43 & 0x3f;
          auVar38 = local_158;
          do {
            psVar9 = ((((pointer)auVar38)->vdata).sel)->sel_vector;
            uVar39 = uVar43;
            if (psVar9 != (sel_t *)0x0) {
              uVar39 = (ulong)psVar9[uVar43];
            }
            puVar10 = (((pointer)auVar38)->vdata).validity.
                      super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar10 == (unsigned_long *)0x0) ||
               ((puVar10[uVar39 >> 6] >> (uVar39 & 0x3f) & 1) != 0)) {
              plVar11 = ((pointer)auVar38)->input_entries;
              plVar1 = (long *)((long)pLVar46 + lVar24 + 8);
              *plVar1 = *plVar1 + plVar11[uVar39].length;
              ListVector::Append(result,((pointer)auVar38)->child_vec,
                                 (((pointer)auVar38)->child_vdata).sel,
                                 plVar11[uVar39].length + plVar11[uVar39].offset,
                                 plVar11[uVar39].offset);
            }
            else if (cVar3 != '\0') {
              if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_198._0_8_ =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_108,(unsigned_long *)local_198);
                uVar18 = local_108._0_8_;
                uVar19 = local_108._8_8_;
                local_108 = ZEXT816(0);
                p_Var12 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                          validity_data.internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)uVar18;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar19;
                if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
                }
                pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (local_180);
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar25->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (long)local_188;
              *puVar2 = *puVar2 & (-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
            }
            auVar38 = (undefined1  [8])((long)auVar38 + 0xa8);
          } while (auVar38 != (undefined1  [8])pLVar37);
        }
        iVar23 = iVar23 + *(long *)((long)pLVar46 + lVar24 + 8);
        uVar43 = uVar43 + 1;
      } while (uVar43 != iVar36);
    }
    ListVector::SetListSize(result,iVar23);
    bVar20 = DataChunk::AllConstant(args);
    if (bVar20) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    ::std::vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_>::
    ~vector((vector<duckdb::ListConcatInputData,_std::allocator<duckdb::ListConcatInputData>_> *)
            local_158);
  }
  else {
    if (cVar3 != '\0') {
      pvVar26 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
      vector = vector<duckdb::Vector,_true>::operator[](&args->data,1);
      VVar4 = pvVar26->vector_type;
      VVar5 = vector->vector_type;
      if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar5 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
        puVar10 = (pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pauVar47 = (undefined1 (*) [16])vector->data;
        pdVar51 = result->data;
        if (((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) &&
           ((puVar10 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
            puVar10 == (unsigned_long *)0x0 || ((*puVar10 & 1) != 0)))) {
          local_158 = *(undefined1 (*) [8])pvVar26->data;
          pLStack_150 = *(pointer *)((long)pvVar26->data + 8);
          local_198 = *pauVar47;
          uVar43 = (ulong)local_158 & 0xffffffff;
          pLVar46 = pLStack_150;
          if (uVar43 < 0xd) {
            pLVar46 = (pointer)(local_158 + 4);
          }
          uVar39 = *(ulong *)*pauVar47 & 0xffffffff;
          puVar44 = *(undefined1 **)(*pauVar47 + 8);
          if (uVar39 < 0xd) {
            puVar44 = local_198 + 4;
          }
          local_108 = (undefined1  [16])
                      StringVector::EmptyString
                                ((StringVector *)result,(Vector *)(uVar43 + uVar39),(idx_t)local_158
                                );
          puVar32 = local_108._8_8_;
          if (local_108._0_4_ < 0xd) {
            puVar32 = local_108 + 4;
          }
          switchD_015ff80e::default(puVar32,pLVar46,uVar43);
          switchD_015ff80e::default(puVar32 + uVar43,puVar44,uVar39);
          uVar43 = (ulong)(uint)local_108._0_4_;
          if (uVar43 < 0xd) {
            switchD_0105b559::default(local_108 + 4 + uVar43,0,0xc - uVar43);
          }
          else {
            local_108._4_4_ = *(undefined4 *)local_108._8_8_;
          }
          *(undefined8 *)pdVar51 = local_108._0_8_;
          *(undefined8 *)(pdVar51 + 8) = local_108._8_8_;
          return;
        }
      }
      else {
        pbVar34 = (buffer_ptr<ValidityBuffer> *)args->count;
        local_180 = pbVar34;
        if ((VVar5 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar51 = pvVar26->data;
          local_170 = (undefined1 (*) [16])vector->data;
          puVar10 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
            Vector::SetVectorType(result,FLAT_VECTOR);
            local_188 = (pointer)result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(pvVar26);
            FlatVector::VerifyFlatVector(result);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       &(pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                      );
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (pbVar34 == (buffer_ptr<ValidityBuffer> *)0x0) {
                return;
              }
              puVar44 = *(undefined1 **)(*local_170 + 8);
              auVar17 = *local_170;
              lVar24 = 8;
              uVar43 = *(ulong *)*local_170 & 0xffffffff;
              iVar36 = extraout_RDX;
              do {
                local_158 = *(undefined1 (*) [8])(pdVar51 + lVar24 + -8);
                pLStack_150 = *(pointer *)(pdVar51 + lVar24);
                uVar39 = (ulong)local_158 & 0xffffffff;
                pLVar46 = pLStack_150;
                if (uVar39 < 0xd) {
                  pLVar46 = (pointer)(local_158 + 4);
                }
                puVar32 = puVar44;
                if (uVar43 < 0xd) {
                  puVar32 = local_198 + 4;
                }
                local_198 = auVar17;
                local_108 = (undefined1  [16])
                            StringVector::EmptyString
                                      ((StringVector *)result,(Vector *)(uVar43 + uVar39),iVar36);
                pcVar45 = local_108._8_8_;
                if (local_108._0_4_ < 0xd) {
                  pcVar45 = local_108 + 4;
                }
                switchD_015ff80e::default(pcVar45,pLVar46,uVar39);
                switchD_015ff80e::default(pcVar45 + uVar39,puVar32,uVar43);
                uVar39 = (ulong)(uint)local_108._0_4_;
                if (uVar39 < 0xd) {
                  switchD_0105b559::default(local_108 + uVar39 + 4,0,0xc - uVar39);
                  iVar36 = extraout_RDX_06;
                }
                else {
                  local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                  iVar36 = extraout_RDX_05;
                }
                *(undefined8 *)((long)local_188 + lVar24 + -8) = local_108._0_8_;
                *(undefined8 *)((data_ptr_t)((long)local_188 + lVar24 + -8) + 8) = local_108._8_8_;
                lVar24 = lVar24 + 0x10;
                local_180 = (buffer_ptr<ValidityBuffer> *)((long)(local_180 + -1) + 0xf);
              } while (local_180 != (buffer_ptr<ValidityBuffer> *)0x0);
              return;
            }
            if ((long)(pbVar34 + 3) + 0xfU < 0x40) {
              return;
            }
            local_168 = (ValidityMask *)((long)(pbVar34 + 3) + 0xfU >> 6);
            local_160 = 0;
            pbVar34 = (buffer_ptr<ValidityBuffer> *)0x0;
            do {
              puVar10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar10 == (unsigned_long *)0x0) {
                pLVar46 = (pointer)0xffffffffffffffff;
              }
              else {
                pLVar46 = (pointer)puVar10[local_160];
              }
              pbVar49 = pbVar34 + 4;
              if (local_180 <= pbVar34 + 4) {
                pbVar49 = local_180;
              }
              pbVar35 = pbVar49;
              if (pLVar46 != (pointer)0x0) {
                pbVar35 = pbVar34;
                if (pLVar46 == (pointer)0xffffffffffffffff) {
                  if (pbVar34 < pbVar49) {
                    uVar43 = *(ulong *)*local_170;
                    local_178 = *(pointer *)(*local_170 + 8);
                    uVar39 = (long)pbVar34 << 4 | 8;
                    uVar29 = uVar43 & 0xffffffff;
                    iVar36 = uVar43;
                    do {
                      local_158 = *(undefined1 (*) [8])(pdVar51 + (uVar39 - 8));
                      pLStack_150 = *(pointer *)(pdVar51 + uVar39);
                      local_198._8_8_ = local_178;
                      local_198._0_8_ = uVar43;
                      uVar28 = (ulong)local_158 & 0xffffffff;
                      pLVar46 = pLStack_150;
                      if (uVar28 < 0xd) {
                        pLVar46 = (pointer)(local_158 + 4);
                      }
                      pLVar37 = local_178;
                      if (uVar29 < 0xd) {
                        pLVar37 = (pointer)(local_198 + 4);
                      }
                      local_108 = (undefined1  [16])
                                  StringVector::EmptyString
                                            ((StringVector *)result,(Vector *)(uVar29 + uVar28),
                                             iVar36);
                      puVar44 = local_108._8_8_;
                      if (local_108._0_4_ < 0xd) {
                        puVar44 = local_108 + 4;
                      }
                      switchD_015ff80e::default(puVar44,pLVar46,uVar28);
                      switchD_015ff80e::default(puVar44 + uVar28,pLVar37,uVar29);
                      uVar28 = (ulong)(uint)local_108._0_4_;
                      if (uVar28 < 0xd) {
                        switchD_0105b559::default(local_108 + uVar28 + 4,0,0xc - uVar28);
                        iVar36 = extraout_RDX_01;
                      }
                      else {
                        local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                        iVar36 = extraout_RDX_00;
                      }
                      *(undefined8 *)((long)local_188 + (uVar39 - 8)) = local_108._0_8_;
                      *(undefined8 *)((data_ptr_t)((long)local_188 + (uVar39 - 8)) + 8) =
                           local_108._8_8_;
                      pbVar34 = (buffer_ptr<ValidityBuffer> *)
                                ((long)&(pbVar34->internal).
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 1);
                      uVar39 = uVar39 + 0x10;
                      pbVar35 = pbVar34;
                    } while (pbVar49 != pbVar34);
                  }
                }
                else if (pbVar34 < pbVar49) {
                  uVar43 = (long)pbVar34 << 4 | 8;
                  uVar39 = 0;
                  local_178 = pLVar46;
                  do {
                    if (((ulong)pLVar46 >> (uVar39 & 0x3f) & 1) != 0) {
                      local_158 = *(undefined1 (*) [8])(pdVar51 + (uVar43 - 8));
                      pLStack_150 = *(pointer *)(pdVar51 + uVar43);
                      local_198 = *local_170;
                      uVar29 = (ulong)local_158 & 0xffffffff;
                      pLVar46 = pLStack_150;
                      if (uVar29 < 0xd) {
                        pLVar46 = (pointer)(local_158 + 4);
                      }
                      uVar28 = *(ulong *)*local_170 & 0xffffffff;
                      puVar44 = *(undefined1 **)(*local_170 + 8);
                      if (uVar28 < 0xd) {
                        puVar44 = local_198 + 4;
                      }
                      local_108 = (undefined1  [16])
                                  StringVector::EmptyString
                                            ((StringVector *)result,(Vector *)(uVar28 + uVar29),
                                             (idx_t)local_170);
                      pcVar45 = local_108._8_8_;
                      if (local_108._0_4_ < 0xd) {
                        pcVar45 = local_108 + 4;
                      }
                      switchD_015ff80e::default(pcVar45,pLVar46,uVar29);
                      switchD_015ff80e::default(pcVar45 + uVar29,puVar44,uVar28);
                      uVar29 = (ulong)(uint)local_108._0_4_;
                      if (uVar29 < 0xd) {
                        switchD_0105b559::default(local_108 + uVar29 + 4,0,0xc - uVar29);
                      }
                      else {
                        local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                      }
                      *(undefined8 *)((long)local_188 + (uVar43 - 8)) = local_108._0_8_;
                      *(undefined8 *)((data_ptr_t)((long)local_188 + (uVar43 - 8)) + 8) =
                           local_108._8_8_;
                      pLVar46 = local_178;
                    }
                    uVar39 = uVar39 + 1;
                    uVar43 = uVar43 + 0x10;
                  } while ((undefined1 *)((long)pbVar34 + (uVar39 - (long)pbVar49)) !=
                           (undefined1 *)0x0);
                  pbVar35 = (buffer_ptr<ValidityBuffer> *)
                            ((long)&(pbVar34->internal).
                                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + uVar39);
                }
              }
              local_160 = local_160 + 1;
              pbVar34 = pbVar35;
            } while ((ValidityMask *)local_160 != local_168);
            return;
          }
        }
        else {
          if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar5 != FLAT_VECTOR) {
            if (VVar5 != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
              UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
              UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_158);
              Vector::ToUnifiedFormat(pvVar26,(idx_t)pbVar34,(UnifiedVectorFormat *)local_108);
              Vector::ToUnifiedFormat(vector,(idx_t)pbVar34,(UnifiedVectorFormat *)local_158);
              Vector::SetVectorType(result,FLAT_VECTOR);
              pdVar51 = result->data;
              local_188 = pLStack_150;
              FlatVector::VerifyFlatVector(result);
              if (local_148 == (pointer)0x0 && local_f8 == (unsigned_long *)0x0) {
                if (pbVar34 != (buffer_ptr<ValidityBuffer> *)0x0) {
                  psVar9 = *(sel_t **)local_108._0_8_;
                  pSVar13 = ((UnifiedVectorFormat *)local_158)->sel;
                  pdVar51 = pdVar51 + 8;
                  puVar44 = (undefined1 *)0x0;
                  do {
                    puVar32 = puVar44;
                    if (psVar9 != (sel_t *)0x0) {
                      puVar32 = (undefined1 *)(ulong)psVar9[(long)puVar44];
                    }
                    puVar33 = puVar44;
                    if (pSVar13 != (SelectionVector *)0x0) {
                      puVar33 = (undefined1 *)
                                (ulong)*(uint *)((long)&pSVar13->sel_vector + (long)puVar44 * 4);
                    }
                    uVar43 = *(ulong *)(local_108._8_8_ + (long)puVar32 * 0x10);
                    pvVar14 = *(void **)(local_108._8_8_ + (long)puVar32 * 0x10 + 8);
                    pSVar15 = (&(local_188->vdata).sel)[(long)puVar33 * 2];
                    pdVar40 = (&(local_188->vdata).data)[(long)puVar33 * 2];
                    uVar39 = uVar43 & 0xffffffff;
                    local_58 = uVar43;
                    local_50 = pvVar14;
                    local_40 = pSVar15;
                    local_38 = pdVar40;
                    local_198 = (undefined1  [16])
                                StringVector::EmptyString
                                          ((StringVector *)result,
                                           (Vector *)(((ulong)pSVar15 & 0xffffffff) + uVar39),uVar43
                                          );
                    pdVar42 = (data_ptr_t)((long)&local_40 + 4);
                    if (0xc < (uint)pSVar15) {
                      pdVar42 = pdVar40;
                    }
                    pvVar48 = (void *)((long)&local_58 + 4);
                    if (0xc < (uint)uVar43) {
                      pvVar48 = pvVar14;
                    }
                    puVar32 = local_198 + 4;
                    if (0xc < local_198._0_4_) {
                      puVar32 = local_198._8_8_;
                    }
                    switchD_015ff80e::default(puVar32,pvVar48,uVar39);
                    switchD_015ff80e::default(puVar32 + uVar39,pdVar42,(ulong)pSVar15 & 0xffffffff);
                    uVar43 = (ulong)(uint)local_198._0_4_;
                    if (uVar43 < 0xd) {
                      switchD_0105b559::default(local_198 + uVar43 + 4,0,0xc - uVar43);
                    }
                    else {
                      local_198._4_4_ = *(undefined4 *)local_198._8_8_;
                    }
                    *(undefined8 *)(pdVar51 + -8) = local_198._0_8_;
                    *(undefined8 *)pdVar51 = local_198._8_8_;
                    puVar44 = puVar44 + 1;
                    pdVar51 = pdVar51 + 0x10;
                  } while (local_180 != (buffer_ptr<ValidityBuffer> *)puVar44);
                }
              }
              else if (pbVar34 != (buffer_ptr<ValidityBuffer> *)0x0) {
                psVar9 = *(sel_t **)local_108._0_8_;
                pSVar13 = ((UnifiedVectorFormat *)local_158)->sel;
                local_178 = (pointer)&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data;
                pdVar51 = pdVar51 + 8;
                puVar44 = (undefined1 *)0x0;
                do {
                  puVar32 = puVar44;
                  if (psVar9 != (sel_t *)0x0) {
                    puVar32 = (undefined1 *)(ulong)psVar9[(long)puVar44];
                  }
                  puVar33 = puVar44;
                  if (pSVar13 != (SelectionVector *)0x0) {
                    puVar33 = (undefined1 *)
                              (ulong)*(uint *)((long)&pSVar13->sel_vector + (long)puVar44 * 4);
                  }
                  if (((local_f8 == (unsigned_long *)0x0) ||
                      ((local_f8[(ulong)puVar32 >> 6] >> ((ulong)puVar32 & 0x3f) & 1) != 0)) &&
                     ((local_148 == (pointer)0x0 ||
                      (((ulong)(&(local_148->vdata).sel)[(ulong)puVar33 >> 6] >>
                        ((ulong)puVar33 & 0x3f) & 1) != 0)))) {
                    uVar43 = *(ulong *)(local_108._8_8_ + (long)puVar32 * 0x10);
                    pvVar14 = *(void **)(local_108._8_8_ + (long)puVar32 * 0x10 + 8);
                    pSVar15 = (&(local_188->vdata).sel)[(long)puVar33 * 2];
                    pdVar40 = (&(local_188->vdata).data)[(long)puVar33 * 2];
                    uVar39 = uVar43 & 0xffffffff;
                    local_58 = uVar43;
                    local_50 = pvVar14;
                    local_40 = pSVar15;
                    local_38 = pdVar40;
                    local_198 = (undefined1  [16])
                                StringVector::EmptyString
                                          ((StringVector *)result,
                                           (Vector *)(((ulong)pSVar15 & 0xffffffff) + uVar39),uVar43
                                          );
                    pdVar42 = (data_ptr_t)((long)&local_40 + 4);
                    if (0xc < (uint)pSVar15) {
                      pdVar42 = pdVar40;
                    }
                    pvVar48 = (void *)((long)&local_58 + 4);
                    if (0xc < (uint)uVar43) {
                      pvVar48 = pvVar14;
                    }
                    pcVar45 = local_198 + 4;
                    if (0xc < local_198._0_4_) {
                      pcVar45 = local_198._8_8_;
                    }
                    switchD_015ff80e::default(pcVar45,pvVar48,uVar39);
                    switchD_015ff80e::default(pcVar45 + uVar39,pdVar42,(ulong)pSVar15 & 0xffffffff);
                    uVar43 = (ulong)(uint)local_198._0_4_;
                    if (uVar43 < 0xd) {
                      switchD_0105b559::default(local_198 + uVar43 + 4,0,0xc - uVar43);
                    }
                    else {
                      local_198._4_4_ = *(undefined4 *)local_198._8_8_;
                    }
                    *(undefined8 *)(pdVar51 + -8) = local_198._0_8_;
                    *(undefined8 *)pdVar51 = local_198._8_8_;
                    pbVar34 = local_180;
                  }
                  else {
                    if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) {
                      local_58 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                 capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_198,&local_58);
                      uVar18 = local_198._0_8_;
                      uVar19 = local_198._8_8_;
                      local_198 = ZEXT816(0);
                      p_Var12 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data.internal.
                                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)uVar18;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar19;
                      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
                      }
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
                      }
                      pTVar25 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                            *)local_178);
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                           (unsigned_long *)
                           (pTVar25->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    bVar16 = (byte)puVar44 & 0x3f;
                    puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_mask + ((ulong)puVar44 >> 6);
                    *puVar2 = *puVar2 & (-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
                  }
                  puVar44 = puVar44 + 1;
                  pdVar51 = pdVar51 + 0x10;
                } while (pbVar34 != (buffer_ptr<ValidityBuffer> *)puVar44);
              }
              if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
              }
              if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
              }
              if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
              }
              if (local_e8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                return;
              }
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
              return;
            }
            pdVar51 = pvVar26->data;
            local_188 = (pointer)vector->data;
            Vector::SetVectorType(result,FLAT_VECTOR);
            pdVar40 = result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(pvVar26);
            FlatVector::VerifyFlatVector(result);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       &(pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                      );
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            FlatVector::VerifyFlatVector(vector);
            local_168 = &result->validity;
            ValidityMask::Combine(&result->validity,&vector->validity,(idx_t)pbVar34);
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (pbVar34 == (buffer_ptr<ValidityBuffer> *)0x0) {
                return;
              }
              lVar24 = 8;
              do {
                local_158 = *(undefined1 (*) [8])(pdVar51 + lVar24 + -8);
                pLStack_150 = *(pointer *)(pdVar51 + lVar24);
                local_198._8_8_ = *(undefined1 **)((long)local_188 + lVar24);
                local_198._0_8_ = *(ulong *)((long)local_188 + lVar24 + -8);
                uVar43 = (ulong)local_158 & 0xffffffff;
                pLVar46 = pLStack_150;
                if (uVar43 < 0xd) {
                  pLVar46 = (pointer)(local_158 + 4);
                }
                uVar39 = *(ulong *)((long)local_188 + lVar24 + -8) & 0xffffffff;
                puVar44 = *(undefined1 **)((long)local_188 + lVar24);
                if (uVar39 < 0xd) {
                  puVar44 = local_198 + 4;
                }
                local_108 = (undefined1  [16])
                            StringVector::EmptyString
                                      ((StringVector *)result,(Vector *)(uVar39 + uVar43),
                                       (idx_t)local_188);
                pcVar45 = local_108._8_8_;
                if (local_108._0_4_ < 0xd) {
                  pcVar45 = local_108 + 4;
                }
                switchD_015ff80e::default(pcVar45,pLVar46,uVar43);
                switchD_015ff80e::default(pcVar45 + uVar43,puVar44,uVar39);
                uVar43 = (ulong)(uint)local_108._0_4_;
                if (uVar43 < 0xd) {
                  switchD_0105b559::default(local_108 + uVar43 + 4,0,0xc - uVar43);
                }
                else {
                  local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                }
                *(undefined8 *)(pdVar40 + lVar24 + -8) = local_108._0_8_;
                *(undefined8 *)(pdVar40 + lVar24 + -8 + 8) = local_108._8_8_;
                lVar24 = lVar24 + 0x10;
                local_180 = (buffer_ptr<ValidityBuffer> *)((long)(local_180 + -1) + 0xf);
              } while (local_180 != (buffer_ptr<ValidityBuffer> *)0x0);
              return;
            }
            if ((long)(pbVar34 + 3) + 0xfU < 0x40) {
              return;
            }
            local_48 = (long)(pbVar34 + 3) + 0xfU >> 6;
            local_160 = 0;
            pbVar34 = (buffer_ptr<ValidityBuffer> *)0x0;
            do {
              puVar10 = (local_168->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar10 == (unsigned_long *)0x0) {
                pauVar47 = (undefined1 (*) [16])0xffffffffffffffff;
              }
              else {
                pauVar47 = (undefined1 (*) [16])puVar10[local_160];
              }
              pbVar49 = pbVar34 + 4;
              if (local_180 <= pbVar34 + 4) {
                pbVar49 = local_180;
              }
              pbVar35 = pbVar49;
              if (pauVar47 != (undefined1 (*) [16])0x0) {
                pbVar35 = pbVar34;
                if (pauVar47 == (undefined1 (*) [16])0xffffffffffffffff) {
                  if (pbVar34 < pbVar49) {
                    uVar43 = (long)pbVar34 << 4 | 8;
                    do {
                      local_158 = *(undefined1 (*) [8])(pdVar51 + (uVar43 - 8));
                      pLStack_150 = *(pointer *)(pdVar51 + uVar43);
                      local_198._8_8_ = *(undefined1 **)((long)local_188 + uVar43);
                      local_198._0_8_ = *(ulong *)((long)local_188 + (uVar43 - 8));
                      uVar39 = (ulong)local_158 & 0xffffffff;
                      pLVar46 = pLStack_150;
                      if (uVar39 < 0xd) {
                        pLVar46 = (pointer)(local_158 + 4);
                      }
                      uVar29 = *(ulong *)((long)local_188 + (uVar43 - 8)) & 0xffffffff;
                      puVar44 = *(undefined1 **)((long)local_188 + uVar43);
                      if (uVar29 < 0xd) {
                        puVar44 = local_198 + 4;
                      }
                      local_108 = (undefined1  [16])
                                  StringVector::EmptyString
                                            ((StringVector *)result,(Vector *)(uVar29 + uVar39),
                                             (idx_t)local_188);
                      pcVar45 = local_108._8_8_;
                      if (local_108._0_4_ < 0xd) {
                        pcVar45 = local_108 + 4;
                      }
                      switchD_015ff80e::default(pcVar45,pLVar46,uVar39);
                      switchD_015ff80e::default(pcVar45 + uVar39,puVar44,uVar29);
                      uVar39 = (ulong)(uint)local_108._0_4_;
                      if (uVar39 < 0xd) {
                        switchD_0105b559::default(local_108 + uVar39 + 4,0,0xc - uVar39);
                      }
                      else {
                        local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                      }
                      *(undefined8 *)(pdVar40 + (uVar43 - 8)) = local_108._0_8_;
                      *(undefined8 *)(pdVar40 + (uVar43 - 8) + 8) = local_108._8_8_;
                      pbVar34 = (buffer_ptr<ValidityBuffer> *)
                                ((long)&(pbVar34->internal).
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 1);
                      uVar43 = uVar43 + 0x10;
                      pbVar35 = pbVar34;
                    } while (pbVar49 != pbVar34);
                  }
                }
                else {
                  local_178 = (pointer)((long)pbVar34 - (long)pbVar49);
                  if (pbVar34 < pbVar49) {
                    uVar43 = (long)pbVar34 << 4 | 8;
                    uVar39 = 0;
                    local_170 = pauVar47;
                    do {
                      if (((ulong)pauVar47 >> (uVar39 & 0x3f) & 1) != 0) {
                        local_158 = *(undefined1 (*) [8])(pdVar51 + (uVar43 - 8));
                        pLStack_150 = *(pointer *)(pdVar51 + uVar43);
                        local_198._8_8_ = *(undefined1 **)((long)local_188 + uVar43);
                        local_198._0_8_ = *(ulong *)((long)local_188 + (uVar43 - 8));
                        uVar29 = (ulong)local_158 & 0xffffffff;
                        pLVar46 = pLStack_150;
                        if (uVar29 < 0xd) {
                          pLVar46 = (pointer)(local_158 + 4);
                        }
                        uVar28 = *(ulong *)((long)local_188 + (uVar43 - 8)) & 0xffffffff;
                        puVar44 = *(undefined1 **)((long)local_188 + uVar43);
                        if (uVar28 < 0xd) {
                          puVar44 = local_198 + 4;
                        }
                        local_108 = (undefined1  [16])
                                    StringVector::EmptyString
                                              ((StringVector *)result,(Vector *)(uVar28 + uVar29),
                                               (idx_t)local_188);
                        pcVar45 = local_108._8_8_;
                        if (local_108._0_4_ < 0xd) {
                          pcVar45 = local_108 + 4;
                        }
                        switchD_015ff80e::default(pcVar45,pLVar46,uVar29);
                        switchD_015ff80e::default(pcVar45 + uVar29,puVar44,uVar28);
                        uVar29 = (ulong)(uint)local_108._0_4_;
                        if (uVar29 < 0xd) {
                          switchD_0105b559::default(local_108 + uVar29 + 4,0,0xc - uVar29);
                        }
                        else {
                          local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                        }
                        *(undefined8 *)(pdVar40 + (uVar43 - 8)) = local_108._0_8_;
                        *(undefined8 *)(pdVar40 + (uVar43 - 8) + 8) = local_108._8_8_;
                        pauVar47 = local_170;
                      }
                      uVar39 = uVar39 + 1;
                      uVar43 = uVar43 + 0x10;
                    } while ((long)&(((original *)&local_178->vdata)->
                                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + uVar39 != 0);
                    pbVar35 = (buffer_ptr<ValidityBuffer> *)
                              ((long)&(pbVar34->internal).
                                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + uVar39);
                  }
                }
              }
              local_160 = local_160 + 1;
              pbVar34 = pbVar35;
            } while (local_160 != local_48);
            return;
          }
          local_170 = (undefined1 (*) [16])pvVar26->data;
          puVar10 = (pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          pdVar51 = vector->data;
          if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
            Vector::SetVectorType(result,FLAT_VECTOR);
            local_188 = (pointer)result->data;
            FlatVector::VerifyFlatVector(result);
            FlatVector::VerifyFlatVector(vector);
            FlatVector::VerifyFlatVector(result);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data)
            ;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (pbVar34 == (buffer_ptr<ValidityBuffer> *)0x0) {
                return;
              }
              pLVar46 = *(pointer *)*local_170;
              pLVar37 = *(pointer *)(*local_170 + 8);
              lVar24 = 8;
              uVar43 = (ulong)pLVar46 & 0xffffffff;
              iVar36 = extraout_RDX_02;
              do {
                local_198._8_8_ = *(undefined1 **)(pdVar51 + lVar24);
                local_198._0_8_ = *(ulong *)(pdVar51 + lVar24 + -8);
                pLVar52 = pLVar37;
                if (uVar43 < 0xd) {
                  pLVar52 = (pointer)(local_158 + 4);
                }
                uVar39 = *(ulong *)(pdVar51 + lVar24 + -8) & 0xffffffff;
                puVar44 = *(undefined1 **)(pdVar51 + lVar24);
                if (uVar39 < 0xd) {
                  puVar44 = local_198 + 4;
                }
                local_158 = (undefined1  [8])pLVar46;
                pLStack_150 = pLVar37;
                local_108 = (undefined1  [16])
                            StringVector::EmptyString
                                      ((StringVector *)result,(Vector *)(uVar43 + uVar39),iVar36);
                pcVar45 = local_108._8_8_;
                if (local_108._0_4_ < 0xd) {
                  pcVar45 = local_108 + 4;
                }
                switchD_015ff80e::default(pcVar45,pLVar52,uVar43);
                switchD_015ff80e::default(pcVar45 + uVar43,puVar44,uVar39);
                uVar39 = (ulong)(uint)local_108._0_4_;
                if (uVar39 < 0xd) {
                  switchD_0105b559::default(local_108 + uVar39 + 4,0,0xc - uVar39);
                  iVar36 = extraout_RDX_08;
                }
                else {
                  local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                  iVar36 = extraout_RDX_07;
                }
                *(undefined8 *)((long)local_188 + lVar24 + -8) = local_108._0_8_;
                *(undefined8 *)((data_ptr_t)((long)local_188 + lVar24 + -8) + 8) = local_108._8_8_;
                lVar24 = lVar24 + 0x10;
                local_180 = (buffer_ptr<ValidityBuffer> *)((long)(local_180 + -1) + 0xf);
              } while (local_180 != (buffer_ptr<ValidityBuffer> *)0x0);
              return;
            }
            if ((long)(pbVar34 + 3) + 0xfU < 0x40) {
              return;
            }
            local_168 = (ValidityMask *)((long)(pbVar34 + 3) + 0xfU >> 6);
            local_160 = 0;
            pbVar34 = (buffer_ptr<ValidityBuffer> *)0x0;
            do {
              puVar10 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar10 == (unsigned_long *)0x0) {
                pLVar46 = (pointer)0xffffffffffffffff;
              }
              else {
                pLVar46 = (pointer)puVar10[local_160];
              }
              pbVar49 = pbVar34 + 4;
              if (local_180 <= pbVar34 + 4) {
                pbVar49 = local_180;
              }
              pbVar35 = pbVar49;
              if (pLVar46 != (pointer)0x0) {
                pbVar35 = pbVar34;
                if (pLVar46 == (pointer)0xffffffffffffffff) {
                  if (pbVar34 < pbVar49) {
                    pLVar46 = *(pointer *)*local_170;
                    local_178 = *(pointer *)(*local_170 + 8);
                    uVar43 = (long)pbVar34 << 4 | 8;
                    uVar39 = (ulong)pLVar46 & 0xffffffff;
                    pLVar37 = pLVar46;
                    do {
                      pLStack_150 = local_178;
                      local_198._8_8_ = *(undefined1 **)(pdVar51 + uVar43);
                      local_198._0_8_ = *(ulong *)(pdVar51 + (uVar43 - 8));
                      pLVar52 = local_178;
                      if (uVar39 < 0xd) {
                        pLVar52 = (pointer)(local_158 + 4);
                      }
                      uVar29 = *(ulong *)(pdVar51 + (uVar43 - 8)) & 0xffffffff;
                      puVar44 = *(undefined1 **)(pdVar51 + uVar43);
                      if (uVar29 < 0xd) {
                        puVar44 = local_198 + 4;
                      }
                      local_158 = (undefined1  [8])pLVar46;
                      local_108 = (undefined1  [16])
                                  StringVector::EmptyString
                                            ((StringVector *)result,(Vector *)(uVar39 + uVar29),
                                             (idx_t)pLVar37);
                      pcVar45 = local_108._8_8_;
                      if (local_108._0_4_ < 0xd) {
                        pcVar45 = local_108 + 4;
                      }
                      switchD_015ff80e::default(pcVar45,pLVar52,uVar39);
                      switchD_015ff80e::default(pcVar45 + uVar39,puVar44,uVar29);
                      uVar29 = (ulong)(uint)local_108._0_4_;
                      if (uVar29 < 0xd) {
                        switchD_0105b559::default(local_108 + uVar29 + 4,0,0xc - uVar29);
                        pLVar37 = extraout_RDX_04;
                      }
                      else {
                        local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                        pLVar37 = extraout_RDX_03;
                      }
                      *(undefined8 *)((long)local_188 + (uVar43 - 8)) = local_108._0_8_;
                      *(undefined8 *)((data_ptr_t)((long)local_188 + (uVar43 - 8)) + 8) =
                           local_108._8_8_;
                      pbVar34 = (buffer_ptr<ValidityBuffer> *)
                                ((long)&(pbVar34->internal).
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 1);
                      uVar43 = uVar43 + 0x10;
                      pbVar35 = pbVar34;
                    } while (pbVar49 != pbVar34);
                  }
                }
                else if (pbVar34 < pbVar49) {
                  uVar43 = (long)pbVar34 << 4 | 8;
                  uVar39 = 0;
                  local_178 = pLVar46;
                  do {
                    if (((ulong)pLVar46 >> (uVar39 & 0x3f) & 1) != 0) {
                      local_158 = *(undefined1 (*) [8])*local_170;
                      pLStack_150 = *(pointer *)(*local_170 + 8);
                      local_198._8_8_ = *(undefined1 **)(pdVar51 + uVar43);
                      local_198._0_8_ = *(ulong *)(pdVar51 + (uVar43 - 8));
                      uVar29 = (ulong)local_158 & 0xffffffff;
                      pLVar46 = pLStack_150;
                      if (uVar29 < 0xd) {
                        pLVar46 = (pointer)(local_158 + 4);
                      }
                      uVar28 = *(ulong *)(pdVar51 + (uVar43 - 8)) & 0xffffffff;
                      puVar44 = *(undefined1 **)(pdVar51 + uVar43);
                      if (uVar28 < 0xd) {
                        puVar44 = local_198 + 4;
                      }
                      local_108 = (undefined1  [16])
                                  StringVector::EmptyString
                                            ((StringVector *)result,(Vector *)(uVar28 + uVar29),
                                             (idx_t)pdVar51);
                      pcVar45 = local_108._8_8_;
                      if (local_108._0_4_ < 0xd) {
                        pcVar45 = local_108 + 4;
                      }
                      switchD_015ff80e::default(pcVar45,pLVar46,uVar29);
                      switchD_015ff80e::default(pcVar45 + uVar29,puVar44,uVar28);
                      uVar29 = (ulong)(uint)local_108._0_4_;
                      if (uVar29 < 0xd) {
                        switchD_0105b559::default(local_108 + uVar29 + 4,0,0xc - uVar29);
                      }
                      else {
                        local_108._4_4_ = *(undefined4 *)local_108._8_8_;
                      }
                      *(undefined8 *)((long)local_188 + (uVar43 - 8)) = local_108._0_8_;
                      *(undefined8 *)((data_ptr_t)((long)local_188 + (uVar43 - 8)) + 8) =
                           local_108._8_8_;
                      pLVar46 = local_178;
                    }
                    uVar39 = uVar39 + 1;
                    uVar43 = uVar43 + 0x10;
                  } while ((undefined1 *)((long)pbVar34 + (uVar39 - (long)pbVar49)) !=
                           (undefined1 *)0x0);
                  pbVar35 = (buffer_ptr<ValidityBuffer> *)
                            ((long)&(pbVar34->internal).
                                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + uVar39);
                }
              }
              local_160 = local_160 + 1;
              pbVar34 = pbVar35;
            } while ((ValidityMask *)local_160 != local_168);
            return;
          }
        }
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      ConstantVector::SetNull(result,true);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_108._8_8_;
    local_108 = auVar17 << 0x40;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_158,args->count,
               (value_type_conflict1 *)local_108,(allocator_type *)local_198);
    if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1a0 = 0;
    }
    else {
      local_1a0 = 0;
      sVar50 = 0;
      do {
        pvVar26 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar50);
        if (pvVar26->vector_type == CONSTANT_VECTOR) {
          puVar10 = (pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
            local_1a0 = local_1a0 + (ulong)*(uint *)pvVar26->data;
          }
        }
        else {
          Vector::SetVectorType(result,FLAT_VECTOR);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(pvVar26,args->count,(UnifiedVectorFormat *)local_108);
          if (args->count != 0) {
            uVar18 = local_108._8_8_;
            sVar53 = 0;
            do {
              sVar27 = sVar53;
              if (*(sel_t **)local_108._0_8_ != (sel_t *)0x0) {
                sVar27 = (size_type)(*(sel_t **)local_108._0_8_)[sVar53];
              }
              if ((local_f8 == (unsigned_long *)0x0) ||
                 ((local_f8[sVar27 >> 6] >> (sVar27 & 0x3f) & 1) != 0)) {
                uVar7 = *(uint *)(uVar18 + sVar27 * 0x10);
                pvVar30 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_158,sVar53);
                *pvVar30 = *pvVar30 + (ulong)uVar7;
              }
              sVar53 = sVar53 + 1;
            } while (sVar53 < args->count);
          }
          if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
          }
          if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
          }
        }
        sVar50 = sVar50 + 1;
      } while (sVar50 < (ulong)(((long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
    pdVar51 = result->data;
    if (args->count != 0) {
      pdVar40 = pdVar51 + 8;
      sVar53 = 0;
      do {
        pvVar30 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_158,sVar53);
        sVar54 = StringVector::EmptyString
                           ((StringVector *)result,(Vector *)(*pvVar30 + local_1a0),len);
        *(long *)(pdVar40 + -8) = sVar54.value._0_8_;
        *(long *)pdVar40 = sVar54.value._8_8_;
        pvVar30 = vector<unsigned_long,_true>::operator[]
                            ((vector<unsigned_long,_true> *)local_158,sVar53);
        *pvVar30 = 0;
        sVar53 = sVar53 + 1;
        pdVar40 = pdVar40 + 0x10;
      } while (sVar53 < args->count);
    }
    if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar50 = 0;
      do {
        pvVar26 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar50);
        local_188 = (pointer)sVar50;
        if (pvVar26->vector_type == CONSTANT_VECTOR) {
          puVar10 = (pvVar26->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar10 == (unsigned_long *)0x0) || ((*puVar10 & 1) != 0)) {
            puVar31 = (uint *)pvVar26->data;
            uVar43 = (ulong)*puVar31;
            if (uVar43 < 0xd) {
              puVar31 = puVar31 + 1;
            }
            else {
              puVar31 = *(uint **)(puVar31 + 2);
            }
            if (args->count != 0) {
              sVar53 = 0;
              pdVar40 = pdVar51 + 4;
              do {
                uVar7 = *(uint *)(pdVar40 + -4);
                pdVar42 = *(data_ptr_t *)(pdVar40 + 4);
                pvVar30 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_158,sVar53);
                if (uVar7 < 0xd) {
                  pdVar42 = pdVar40;
                }
                switchD_015ff80e::default(pdVar42 + *pvVar30,puVar31,uVar43);
                pvVar30 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_158,sVar53);
                *pvVar30 = *pvVar30 + uVar43;
                sVar53 = sVar53 + 1;
                pdVar40 = pdVar40 + 0x10;
              } while (sVar53 < args->count);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
          Vector::ToUnifiedFormat(pvVar26,args->count,(UnifiedVectorFormat *)local_108);
          if (args->count != 0) {
            uVar18 = local_108._8_8_;
            sVar53 = 0;
            pdVar40 = pdVar51 + 4;
            do {
              sVar27 = sVar53;
              if (*(sel_t **)local_108._0_8_ != (sel_t *)0x0) {
                sVar27 = (size_type)(*(sel_t **)local_108._0_8_)[sVar53];
              }
              if ((local_f8 == (unsigned_long *)0x0) ||
                 ((local_f8[sVar27 >> 6] >> (sVar27 & 0x3f) & 1) != 0)) {
                lVar24 = sVar27 * 0x10;
                uVar7 = *(uint *)(uVar18 + lVar24);
                pdVar42 = *(data_ptr_t *)(uVar18 + lVar24 + 8);
                uVar6 = *(uint *)(pdVar40 + -4);
                pdVar41 = *(data_ptr_t *)(pdVar40 + 4);
                pvVar30 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_158,sVar53);
                if (uVar6 < 0xd) {
                  pdVar41 = pdVar40;
                }
                if (uVar7 < 0xd) {
                  pdVar42 = (data_ptr_t)(uVar18 + lVar24 + 4);
                }
                switchD_015ff80e::default(pdVar41 + *pvVar30,pdVar42,(ulong)uVar7);
                pvVar30 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)local_158,sVar53);
                *pvVar30 = *pvVar30 + (ulong)uVar7;
              }
              sVar53 = sVar53 + 1;
              pdVar40 = pdVar40 + 0x10;
            } while (sVar53 < args->count);
          }
          if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
          }
          if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
          }
        }
        sVar50 = (long)local_188 + 1;
      } while (sVar50 < (ulong)(((long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
    if (args->count != 0) {
      pdVar51 = pdVar51 + 4;
      uVar43 = 0;
      do {
        uVar39 = (ulong)*(uint *)(pdVar51 + -4);
        if (uVar39 < 0xd) {
          switchD_0105b559::default(pdVar51 + uVar39,0,0xc - uVar39);
        }
        else {
          *(undefined4 *)pdVar51 = **(undefined4 **)(pdVar51 + 4);
        }
        uVar43 = uVar43 + 1;
        pdVar51 = pdVar51 + 0x10;
      } while (uVar43 < args->count);
    }
    if (local_158 != (undefined1  [8])0x0) {
      operator_delete((void *)local_158);
    }
  }
  return;
}

Assistant:

static void ConcatFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ConcatFunctionData>();
	if (info.return_type.id() == LogicalTypeId::LIST) {
		return ListConcatFunction(args, state, result, info.is_operator);
	} else if (info.is_operator) {
		return ConcatOperator(args, state, result);
	}
	return StringConcatFunction(args, state, result);
}